

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

void kratos::hash_generator_name(Context *context,Generator *generator)

{
  uint64_t hash;
  
  hash = hash_64_fnv1a((generator->name)._M_dataplus._M_p,(generator->name)._M_string_length);
  Context::add_hash(context,generator,hash);
  return;
}

Assistant:

void hash_generator_name(Context* context, Generator* generator) {
    auto const& name = generator->name;
    uint64_t hash = hash_64_fnv1a(name.c_str(), name.size());
    context->add_hash(generator, hash);
}